

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O0

void __thiscall
TPZSkylMatrix<double>::DecomposeColumn(TPZSkylMatrix<double> *this,int64_t col,int64_t prevcol)

{
  int64_t iVar1;
  int64_t iVar2;
  double *pdVar3;
  double *pdVar4;
  long in_RDX;
  long in_RSI;
  TPZSkylMatrix<double> *in_RDI;
  double sum;
  double *run2;
  double *run1;
  int64_t minline;
  int64_t skcol;
  int64_t skprev;
  double *ptrcol;
  double *ptrprev;
  int64_t in_stack_ffffffffffffff98;
  int64_t in_stack_ffffffffffffffa8;
  double dVar5;
  TPZSkylMatrix<double> *in_stack_ffffffffffffffb0;
  double *local_48;
  long local_40;
  
  iVar1 = SkyHeight(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  iVar2 = SkyHeight(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  pdVar3 = Diag(in_RDI,in_stack_ffffffffffffff98);
  pdVar4 = Diag(in_RDI,in_stack_ffffffffffffff98);
  if (in_RSI - iVar2 < in_RDX - iVar1) {
    local_40 = in_RDX - iVar1;
  }
  else {
    local_40 = in_RSI - iVar2;
  }
  if (in_RDX < local_40) {
    std::operator<<((ostream *)&std::cout,"error condition\n");
    std::ostream::flush();
  }
  else {
    dVar5 = 0.0;
    pdVar4 = pdVar4 + (in_RSI - local_40);
    for (local_48 = pdVar3 + (in_RDX - local_40); local_48 != pdVar3; local_48 = local_48 + -1) {
      dVar5 = *local_48 * *pdVar4 + dVar5;
      pdVar4 = pdVar4 + -1;
    }
    *pdVar4 = *pdVar4 - dVar5;
    if (local_48 == pdVar4) {
      dVar5 = sqrt(*pdVar4);
      *pdVar4 = dVar5;
    }
    else {
      *pdVar4 = *pdVar4 / *local_48;
    }
  }
  return;
}

Assistant:

void TPZSkylMatrix<TVar>::DecomposeColumn(int64_t col, int64_t prevcol){
    TVar *ptrprev;     //Pointer to prev column
    TVar *ptrcol;      //Pointer to col column
    int64_t skprev, skcol; //prev and col Skyline height respectively
    int64_t minline;
    
    skprev = SkyHeight(prevcol);
    skcol = SkyHeight(col);
    
    ptrprev = Diag(prevcol);
    ptrcol = Diag(col);
    
    if((prevcol-skprev) > (col-skcol)){
        minline = prevcol - skprev;
    }else
    {
        minline = col - skcol;
    }
    if(minline > prevcol) {
        cout << "error condition\n";
        cout.flush();
        return;
    }
    TVar *run1 = ptrprev + (prevcol-minline);
    TVar *run2 = ptrcol + (col-minline);
    TVar sum = 0;
    
    while(run1 != ptrprev) sum += (*run1--)*(*run2--);
    *run2-=sum;
    if(run1 != run2){
        *run2 /= *run1;
    }else{
        *run2=sqrt(*run2);
    }
    
}